

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_buffer_encoder.c
# Opt level: O3

size_t lzma_block_buffer_bound(size_t uncompressed_size)

{
  ulong uVar1;
  
  if ((uncompressed_size < 0x7ffffffffffffbbd) &&
     (uVar1 = uncompressed_size + 0xffff >> 0x10,
     uncompressed_size <= uVar1 * -3 + 0x7ffffffffffffbbb)) {
    return (uncompressed_size + uVar1 * 3 + 4 & 0xfffffffffffffffc) + 0x5c;
  }
  return 0;
}

Assistant:

extern LZMA_API(size_t)
lzma_block_buffer_bound(size_t uncompressed_size)
{
	uint64_t ret = lzma_block_buffer_bound64(uncompressed_size);

#if SIZE_MAX < UINT64_MAX
	// Catch the possible integer overflow on 32-bit systems.
	if (ret > SIZE_MAX)
		return 0;
#endif

	return ret;
}